

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_16.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  long *plVar4;
  int local_2c;
  undefined1 local_28 [4];
  int i;
  vector<int,_std::allocator<int>_> numbers;
  
  numbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  poVar3 = std::operator<<((ostream *)&std::cout,"Enter sequence of numbers separated by space.");
  std::operator<<(poVar3,"\nTo terminate the input enter \'.\' and press \'enter\':\n");
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_28);
  local_2c = 0;
  while( true ) {
    plVar4 = (long *)std::istream::operator>>((istream *)&std::cin,&local_2c);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
    if (!bVar1) break;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_28,&local_2c);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"The mode is: ");
  iVar2 = findMode<int>((vector<int,_std::allocator<int>_> *)local_28);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  numbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return numbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int main()
{
	std::cout << "Enter sequence of numbers separated by space."
			  << "\nTo terminate the input enter '.' and press 'enter':\n";

	std::vector<int> numbers;
	for (auto i = 0; std::cin >> i;)
		numbers.push_back(i);
	std::cout << "The mode is: " << findMode(numbers) << std::endl;
	return 0;
}